

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliques.cpp
# Opt level: O0

void find_cliques(void)

{
  reference pvVar1;
  iterator __first;
  iterator __last;
  ostream *poVar2;
  size_type sVar3;
  reference __k;
  mapped_type *pmVar4;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  int local_12c;
  int local_128;
  int j;
  int i_2;
  int i_1;
  int max_counter;
  int max_size;
  set<int,_std::less<int>,_std::allocator<int>_> local_108;
  set<int,_std::less<int>,_std::allocator<int>_> local_d8;
  set<int,_std::less<int>,_std::allocator<int>_> local_a8;
  int *local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  value_type_conflict local_3c;
  undefined1 local_38 [4];
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> P;
  
  freopen("cliques.txt","w",_stdout);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_38);
  for (local_3c = 0; local_3c < V; local_3c = local_3c + 1) {
    pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_38,&local_3c);
    local_60 = (_Base_ptr)pVar5.first._M_node;
    local_58 = pVar5.second;
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&edge,(long)local_3c);
    local_68._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar1);
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&edge,(long)local_3c);
    local_70 = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar1);
    std::stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_68,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_70)
    ;
  }
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_a8._M_t._M_impl._0_8_ = 0;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_a8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (&local_d8,(set<int,_std::less<int>,_std::allocator<int>_> *)local_38);
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_108._M_t._M_impl._0_8_ = 0;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_108);
  bron_kerbosch(&local_a8,&local_d8,&local_108);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_108);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_d8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_a8);
  __first = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)(anonymous_namespace)::cliques);
  __last = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(anonymous_namespace)::cliques);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,bool(*)(std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)>
            ((__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              )__last._M_current,anon_unknown.dwarf_12fdf::compare_vectors_by_size);
  poVar2 = std::operator<<((ostream *)&std::cout,"Distribution:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  i_1 = 0;
  i_2 = 0;
  sVar3 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(anonymous_namespace)::cliques);
  j = (int)sVar3;
  while (j = j + -1, -1 < j) {
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(anonymous_namespace)::cliques,(long)j);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar1);
    if ((ulong)(long)i_1 < sVar3) {
      if (0 < i_2) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i_1);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_2);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      pvVar1 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(anonymous_namespace)::cliques,(long)j);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar1);
      i_1 = (int)sVar3;
      i_2 = 0;
    }
    i_2 = i_2 + 1;
  }
  if (0 < i_2) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i_1);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,i_2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Cliques:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_128 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(anonymous_namespace)::cliques);
    if (sVar3 <= (ulong)(long)local_128) break;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_128 + 1);
    poVar2 = std::operator<<(poVar2,"(");
    pvVar1 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)(anonymous_namespace)::cliques,(long)local_128);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2,"): ");
    local_12c = 0;
    while( true ) {
      pvVar1 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(anonymous_namespace)::cliques,(long)local_128);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar1);
      if (sVar3 <= (ulong)(long)local_12c) break;
      pvVar1 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(anonymous_namespace)::cliques,(long)local_128);
      __k = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,(long)local_12c);
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name_abi_cxx11_,__k);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
      std::operator<<(poVar2,". ");
      local_12c = local_12c + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_128 = local_128 + 1;
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

void find_cliques() {
    freopen("cliques.txt", "w", stdout); // output file

    set <int> P;
    for (int i = 0; i < V; i++) {
        P.insert(i);
        stable_sort(edge[i].begin(), edge[i].end());
    }
    
    bron_kerbosch(set<int>(), P, set<int>());

    stable_sort(cliques.begin(), cliques.end(), compare_vectors_by_size);

    cout << "Distribution:" << endl;
    int max_size = 0;
    int max_counter = 0;
    for (int i = cliques.size()-1; i >= 0 ; i--) {
        if (cliques[i].size() > max_size) {
            if (max_counter > 0) {
                cout << max_size << ": " << max_counter << endl;
            }
            max_size = cliques[i].size();
            max_counter = 0;
        }

        max_counter++;
    }
    if (max_counter > 0) {
        cout << max_size << ": " << max_counter << endl;
    }

    cout << "Cliques:" << endl;
    for (int i = 0; i < cliques.size(); i++) {
        cout << i + 1 << "(" << cliques[i].size() << "): ";
        for (int j = 0; j < cliques[i].size(); j++) {
            cout << name[cliques[i][j]] << ". ";
        }
        cout << endl;
    }
}